

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_refine(lysp_yang_ctx *ctx,lysp_refine **refines)

{
  LY_ERR LVar1;
  lysp_refine *str_p;
  char *pcVar2;
  ly_ctx *local_f0;
  ly_ctx *local_e8;
  ly_ctx *local_d0;
  char *local_c8;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  undefined8 *puStack_58;
  LY_ERR ret__;
  char *p__;
  lysp_refine *rf;
  size_t sStack_40;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_refine **pplStack_20;
  LY_ERR ret;
  lysp_refine **refines_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_20 = refines;
  refines_local = (lysp_refine **)ctx;
  if (*refines == (lysp_refine *)0x0) {
    puStack_58 = (undefined8 *)malloc(0x58);
    if (puStack_58 == (undefined8 *)0x0) {
      if (refines_local == (lysp_refine **)0x0) {
        local_a0 = (ly_ctx *)0x0;
      }
      else {
        local_a0 = *(ly_ctx **)
                    **(undefined8 **)
                      (refines_local[7]->dsc +
                      (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
      }
      ly_log(local_a0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_refine");
      return LY_EMEM;
    }
    *puStack_58 = 1;
  }
  else {
    *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + 1;
    puStack_58 = (undefined8 *)
                 realloc(&(*refines)[-1].flags,*(long *)&(*refines)[-1].flags * 0x50 + 8);
    if (puStack_58 == (undefined8 *)0x0) {
      *(long *)&(*pplStack_20)[-1].flags = *(long *)&(*pplStack_20)[-1].flags + -1;
      if (refines_local == (lysp_refine **)0x0) {
        local_98 = (ly_ctx *)0x0;
      }
      else {
        local_98 = *(ly_ctx **)
                    **(undefined8 **)
                      (refines_local[7]->dsc +
                      (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
      }
      ly_log(local_98,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_refine");
      return LY_EMEM;
    }
  }
  *pplStack_20 = (lysp_refine *)(puStack_58 + 1);
  str_p = *pplStack_20 + *(long *)&(*pplStack_20)[-1].flags + -1;
  memset(str_p,0,0x50);
  LVar1 = get_argument((lysp_yang_ctx *)refines_local,Y_STR_ARG,(uint16_t *)0x0,(char **)&word_len,
                       &word,&stack0xffffffffffffffc0);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (sStack_40 == 0) {
    if (refines_local == (lysp_refine **)0x0) {
      local_a8 = (ly_ctx *)0x0;
    }
    else {
      local_a8 = *(ly_ctx **)
                  **(undefined8 **)
                    (refines_local[7]->dsc +
                    (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
    }
    ly_log(local_a8,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
           "refine");
  }
  if (word == (char *)0x0) {
    if (refines_local == (lysp_refine **)0x0) {
      local_b8 = (ly_ctx *)0x0;
    }
    else {
      local_b8 = *(ly_ctx **)
                  **(undefined8 **)
                    (refines_local[7]->dsc +
                    (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
    }
    if (sStack_40 == 0) {
      local_c8 = "";
    }
    else {
      local_c8 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_b8,local_c8,sStack_40,&str_p->nodeid);
  }
  else {
    if (refines_local == (lysp_refine **)0x0) {
      local_b0 = (ly_ctx *)0x0;
    }
    else {
      local_b0 = *(ly_ctx **)
                  **(undefined8 **)
                    (refines_local[7]->dsc +
                    (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_b0,(char *)word_len,&str_p->nodeid);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)refines_local,(ly_stmt *)((long)&rf + 4),
                            (char **)&word_len,&stack0xffffffffffffffc0);
    if (buf._4_4_ == LY_SUCCESS) {
      if (rf._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar1 = buf._4_4_;
      }
      else {
        if (rf._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (refines_local == (lysp_refine **)0x0) {
            local_d0 = (ly_ctx *)0x0;
          }
          else {
            local_d0 = *(ly_ctx **)
                        **(undefined8 **)
                          (refines_local[7]->dsc +
                          (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
          }
          pcVar2 = lyplg_ext_stmt2str(rf._4_4_);
          ly_vlog(local_d0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
          return LY_EVALID;
        }
        LVar1 = get_keyword((lysp_yang_ctx *)refines_local,(ly_stmt *)((long)&rf + 4),
                            (char **)&word_len,&stack0xffffffffffffffc0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        ret___2._3_1_ = rf._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar1 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar1, !(bool)ret___2._3_1_) {
        if (rf._4_4_ == LY_STMT_CONFIG) {
          LVar1 = parse_config((lysp_yang_ctx *)refines_local,&str_p->flags,&str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_DEFAULT) {
          LVar1 = parse_qnames((lysp_yang_ctx *)refines_local,LY_STMT_DEFAULT,&str_p->dflts,
                               Y_STR_ARG,&str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_DESCRIPTION) {
          LVar1 = parse_text_field((lysp_yang_ctx *)refines_local,str_p->dsc,LY_STMT_DESCRIPTION,0,
                                   &str_p->dsc,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
          LVar1 = parse_ext((lysp_yang_ctx *)refines_local,(char *)word_len,sStack_40,str_p,
                            LY_STMT_REFINE,0,&str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_IF_FEATURE) {
          if (*(byte *)(*(long *)(refines_local[7]->dsc +
                                 (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8) +
                       0x78) < 2) {
            if (refines_local == (lysp_refine **)0x0) {
              local_e8 = (ly_ctx *)0x0;
            }
            else {
              local_e8 = *(ly_ctx **)
                          **(undefined8 **)
                            (refines_local[7]->dsc +
                            (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
            }
            ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ,"if-feature","refine");
            return LY_EVALID;
          }
          LVar1 = parse_qnames((lysp_yang_ctx *)refines_local,LY_STMT_IF_FEATURE,&str_p->iffeatures,
                               Y_STR_ARG,&str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_MANDATORY) {
          LVar1 = parse_mandatory((lysp_yang_ctx *)refines_local,&str_p->flags,&str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_MAX_ELEMENTS) {
          LVar1 = parse_maxelements((lysp_yang_ctx *)refines_local,&str_p->max,&str_p->flags,
                                    &str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_MIN_ELEMENTS) {
          LVar1 = parse_minelements((lysp_yang_ctx *)refines_local,&str_p->min,&str_p->flags,
                                    &str_p->exts);
        }
        else if (rf._4_4_ == LY_STMT_MUST) {
          LVar1 = parse_restrs((lysp_yang_ctx *)refines_local,LY_STMT_MUST,&str_p->musts);
        }
        else if (rf._4_4_ == LY_STMT_PRESENCE) {
          LVar1 = parse_text_field((lysp_yang_ctx *)refines_local,str_p->presence,LY_STMT_PRESENCE,0
                                   ,&str_p->presence,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
        }
        else {
          if (rf._4_4_ != LY_STMT_REFERENCE) {
            if (refines_local == (lysp_refine **)0x0) {
              local_f0 = (ly_ctx *)0x0;
            }
            else {
              local_f0 = *(ly_ctx **)
                          **(undefined8 **)
                            (refines_local[7]->dsc +
                            (ulong)(*(int *)((long)&refines_local[7]->nodeid + 4) - 1) * 8);
            }
            pcVar2 = lyplg_ext_stmt2str(rf._4_4_);
            ly_vlog(local_f0,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,"refine");
            return LY_EVALID;
          }
          LVar1 = parse_text_field((lysp_yang_ctx *)refines_local,str_p->ref,LY_STMT_REFERENCE,0,
                                   &str_p->ref,Y_STR_ARG,(uint16_t *)0x0,&str_p->exts);
        }
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)refines_local,(ly_stmt *)((long)&rf + 4),
                                (char **)&word_len,&stack0xffffffffffffffc0);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar1 = LY_SUCCESS;
        if (rf._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if ((str_p->exts != (lysp_ext_instance *)0x0) &&
             (LVar1 = ly_set_add((ly_set *)&refines_local[8]->presence,str_p->exts,'\x01',
                                 (uint32_t *)0x0), LVar1 != LY_SUCCESS)) {
            return LVar1;
          }
          buf._4_4_ = LVar1;
          ret___2._3_1_ = true;
          LVar1 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_refine(struct lysp_yang_ctx *ctx, struct lysp_refine **refines)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_refine *rf;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *refines, rf, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));
    CHECK_NONEMPTY(ctx, word_len, "refine");
    INSERT_WORD_GOTO(ctx, buf, rf->nodeid, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &rf->flags, &rf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_DEFAULT, &rf->dflts, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, rf->dsc, LY_STMT_DESCRIPTION, 0, &rf->dsc, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "refine");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &rf->iffeatures, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &rf->max, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &rf->min, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &rf->musts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &rf->flags, &rf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, rf->ref, LY_STMT_REFERENCE, 0, &rf->ref, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(parse_text_field(ctx, rf->presence, LY_STMT_PRESENCE, 0, &rf->presence, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rf, LY_STMT_REFINE, 0, &rf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "refine");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, rf->exts, ret, cleanup);
    }

cleanup:
    return ret;
}